

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O2

shared_ptr<mprpc::MpRpcMessage> __thiscall
mprpc::MpRpcMessage::parse(MpRpcMessage *this,char *utf8_buf,size_t len)

{
  msgpack_object *pmVar1;
  msgpack_object *pmVar2;
  uint64_t uVar3;
  undefined4 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  msgpack_unpack_return mVar7;
  int iVar8;
  element_type *peVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar10;
  ulong uVar11;
  uint32_t n;
  ulong uVar12;
  shared_ptr<mprpc::MpRpcMessage> sVar13;
  shared_ptr<mprpc::MpRpcMessage> rpcmsg;
  string str;
  
  std::make_shared<mprpc::MpRpcMessage>();
  if (*utf8_buf == 'S') {
    bVar6 = snappy::Uncompress(utf8_buf + 5,len - 5,
                               &(rpcmsg.
                                 super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_recv_data);
    if (bVar6) goto LAB_001591a2;
  }
  else {
    std::__cxx11::string::assign
              ((char *)&(rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->_recv_data,(ulong)utf8_buf);
LAB_001591a2:
    mVar7 = msgpack_unpack(((rpcmsg.
                             super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_recv_data)._M_dataplus._M_p,
                           ((rpcmsg.
                             super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_recv_data)._M_string_length,(size_t *)0x0,
                           &(rpcmsg.
                             super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->mp_zone,
                           &(rpcmsg.
                             super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->root);
    if ((mVar7 == MSGPACK_UNPACK_SUCCESS) &&
       (((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->root).
        type == MSGPACK_OBJECT_MAP)) {
      peVar9 = rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      for (uVar11 = 0;
          _Var5._M_pi = rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi, uVar11 < (peVar9->root).via.array.size;
          uVar11 = uVar11 + 1) {
        pmVar1 = (peVar9->root).via.array.ptr;
        if (pmVar1[uVar11 * 2].type == MSGPACK_OBJECT_STR) {
          pmVar2 = pmVar1[uVar11 * 2].via.array.ptr;
          str._M_dataplus._M_p = (pointer)&str.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&str,pmVar2,
                     (long)&pmVar2->type + (ulong)pmVar1[uVar11 * 2].via.array.size);
          bVar6 = std::operator==(&str,"id");
          if (bVar6) {
            if ((pmVar1[uVar11 * 2 + 1].type == MSGPACK_OBJECT_POSITIVE_INTEGER) ||
               (pmVar1[uVar11 * 2 + 1].type == MSGPACK_OBJECT_NEGATIVE_INTEGER)) {
              (rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              id = pmVar1[uVar11 * 2 + 1].via.array.size;
            }
          }
          else {
            bVar6 = std::operator==(&str,"method");
            if (bVar6) {
              if (pmVar1[uVar11 * 2 + 1].type == MSGPACK_OBJECT_STR) {
                std::__cxx11::string::assign
                          ((char *)rpcmsg.
                                   super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,(ulong)pmVar1[uVar11 * 2 + 1].via.array.ptr);
              }
            }
            else {
              bVar6 = std::operator==(&str,"params");
              if (bVar6) {
                ((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->params).via.array.ptr = pmVar1[uVar11 * 2 + 1].via.array.ptr;
                uVar4 = *(undefined4 *)&pmVar1[uVar11 * 2 + 1].field_0x4;
                uVar3 = pmVar1[uVar11 * 2 + 1].via.u64;
                ((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->params).type = pmVar1[uVar11 * 2 + 1].type;
                *(undefined4 *)
                 &((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->params).field_0x4 = uVar4;
                ((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->params).via.u64 = uVar3;
              }
              else {
                bVar6 = std::operator==(&str,"result");
                if (bVar6) {
                  ((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->result).via.array.ptr = pmVar1[uVar11 * 2 + 1].via.array.ptr;
                  uVar4 = *(undefined4 *)&pmVar1[uVar11 * 2 + 1].field_0x4;
                  uVar3 = pmVar1[uVar11 * 2 + 1].via.u64;
                  ((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->result).type = pmVar1[uVar11 * 2 + 1].type;
                  *(undefined4 *)
                   &((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->result).field_0x4 = uVar4;
                  ((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->result).via.u64 = uVar3;
                }
                else {
                  bVar6 = std::operator==(&str,"error");
                  if ((bVar6) && (pmVar1[uVar11 * 2 + 1].type == MSGPACK_OBJECT_MAP)) {
                    lVar10 = 0x28;
                    for (uVar12 = 0; uVar12 < pmVar1[uVar11 * 2 + 1].via.array.size;
                        uVar12 = uVar12 + 1) {
                      pmVar2 = pmVar1[uVar11 * 2 + 1].via.array.ptr;
                      if (*(int *)((long)pmVar2 + lVar10 + -0x28) == 5) {
                        if (**(int **)((long)(pmVar2 + 0xffffffffffffffff) + lVar10) == 0x65646f63)
                        {
                          if ((*(uint *)((long)pmVar2 + lVar10 + -0x10) & 0xfffffffe) == 2) {
                            (rpcmsg.
                             super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->err_code = *(int *)((long)pmVar2 + lVar10 + -8);
                          }
                        }
                        else {
                          iVar8 = bcmp(*(int **)((long)(pmVar2 + 0xffffffffffffffff) + lVar10),
                                       "message",7);
                          if ((iVar8 == 0) && (*(int *)((long)pmVar2 + lVar10 + -0x10) == 5)) {
                            std::__cxx11::string::assign
                                      ((char *)&(rpcmsg.
                                                 super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_ptr)->err_msg,
                                       *(ulong *)((long)&pmVar2->type + lVar10));
                          }
                        }
                      }
                      lVar10 = lVar10 + 0x30;
                    }
                  }
                }
              }
            }
          }
          std::__cxx11::string::~string((string *)&str);
          peVar9 = rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
        }
      }
      (this->method)._M_dataplus._M_p = (pointer)peVar9;
      rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->method)._M_string_length = (size_type)_Var5._M_pi;
      rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      goto LAB_001593cf;
    }
  }
  (this->method)._M_dataplus._M_p = (pointer)0x0;
  (this->method)._M_string_length = 0;
LAB_001593cf:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  sVar13.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar13.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<mprpc::MpRpcMessage>)
         sVar13.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<MpRpcMessage> MpRpcMessage::parse(const char* utf8_buf, size_t len)
    {
        auto rpcmsg = make_shared<MpRpcMessage>();

        try {
            if (utf8_buf[0] == 'S') {
                //uint32_t orig_len = *(uint32_t*)(utf8_buf + 1);
                if (!snappy::Uncompress(utf8_buf + 5, len - 5, &rpcmsg->_recv_data))
                    return nullptr;
            }
            else {
                rpcmsg->_recv_data.assign(utf8_buf, len);
            }
            msgpack_unpack_return ret = msgpack_unpack(rpcmsg->_recv_data.c_str(), rpcmsg->_recv_data.size(),
                                                       nullptr, &rpcmsg->mp_zone, &rpcmsg->root);
            if ( ret != MSGPACK_UNPACK_SUCCESS)
                return nullptr;

            if (!is_map(rpcmsg->root)) return nullptr;

            for (uint32_t i = 0; i < rpcmsg->root.via.map.size; i++) {
                auto o = rpcmsg->root.via.map.ptr + i;
                if (o->key.type != MSGPACK_OBJECT_STR) continue;
                const string str(o->key.via.str.ptr, o->key.via.str.size);
                if (str == "id") {
                    if (o->val.type == MSGPACK_OBJECT_NEGATIVE_INTEGER)
                        rpcmsg->id = (int)o->val.via.i64;
                    else if (o->val.type == MSGPACK_OBJECT_POSITIVE_INTEGER)
                        rpcmsg->id = (int)o->val.via.u64;
                }
                else if (str == "method") {
                    if (o->val.type == MSGPACK_OBJECT_STR)
                        rpcmsg->method.assign(o->val.via.str.ptr, o->val.via.str.size);
                }
                else if (str == "params") {
                    rpcmsg->params = o->val;
                }
                else if (str == "result") {
                    rpcmsg->result = o->val;
                }
                else if (str == "error") {
                    if (o->val.type == MSGPACK_OBJECT_MAP) {
                        for (uint32_t n = 0; n < o->val.via.map.size; n++) {
                            auto p = o->val.via.map.ptr + n;
                            if (p->key.type == MSGPACK_OBJECT_STR && memcmp(p->key.via.str.ptr, "code", 4) == 0) {
                                if (p->val.type == MSGPACK_OBJECT_NEGATIVE_INTEGER)
                                    rpcmsg->err_code = (int)p->val.via.i64;
                                else if (p->val.type == MSGPACK_OBJECT_POSITIVE_INTEGER)
                                    rpcmsg->err_code = (int)p->val.via.u64;
                            }
                            else if (p->key.type == MSGPACK_OBJECT_STR && memcmp(p->key.via.str.ptr, "message", 7) == 0) {
                                if (p->val.type == MSGPACK_OBJECT_STR)
                                    rpcmsg->err_msg.assign(p->val.via.str.ptr, p->val.via.str.size);
                            }
                        }
                    }
                }
#if 0
                else if (str == "debug") {
                    if (o->val.type == MSGPACK_OBJECT_MAP) {
                        uint64_t recv_time = 0;
                        uint64_t send_time = 0;
                        for (uint32_t n = 0; n < o->val.via.map.size; n++) {
                            auto p = o->val.via.map.ptr + n;
                            if (p->key.type == MSGPACK_OBJECT_STR) {
                                if (memcmp(p->key.via.str.ptr, "recv_time", 9) == 0)
                                    recv_time = p->val.via.u64;
                                else if (memcmp(p->key.via.str.ptr, "send_time", 9) == 0)
                                    send_time = p->val.via.u64;
                            }
                        }
                        std::cout << "rsp_time: " << rpcmsg->method << " "
                            << (send_time - recv_time) << " "
                            << time_point_cast<microseconds>(system_clock::now()).time_since_epoch().count() - recv_time
                            << endl;
                    }
                }
#endif
            }
            return rpcmsg;
        }
        catch (exception& e) {
            cerr << "parse conf failure: " << e.what();
            return nullptr;
        }
    }